

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifUtil.c
# Opt level: O1

void If_CutTraverse(If_Man_t *p,If_Obj_t *pRoot,If_Cut_t *pCut,Vec_Ptr_t *vNodes)

{
  float fVar1;
  uint uVar2;
  uint *puVar3;
  void **ppvVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  
  vNodes->nSize = 0;
  if (0xffffff < *(uint *)&pCut->field_0x1c) {
    uVar6 = 0;
    do {
      fVar1 = (&pCut[1].Area)[uVar6];
      if (((long)(int)fVar1 < 0) || (p->vObjs->nSize <= (int)fVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar3 = (uint *)p->vObjs->pArray[(int)fVar1];
      if (puVar3 == (uint *)0x0) break;
      uVar2 = vNodes->nCap;
      if (vNodes->nSize == uVar2) {
        if ((int)uVar2 < 0x10) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc(0x80);
          }
          else {
            ppvVar4 = (void **)realloc(vNodes->pArray,0x80);
          }
          vNodes->pArray = ppvVar4;
          iVar7 = 0x10;
        }
        else {
          iVar7 = uVar2 * 2;
          if (iVar7 <= (int)uVar2) goto LAB_0043eaa6;
          if (vNodes->pArray == (void **)0x0) {
            ppvVar4 = (void **)malloc((ulong)uVar2 << 4);
          }
          else {
            ppvVar4 = (void **)realloc(vNodes->pArray,(ulong)uVar2 << 4);
          }
          vNodes->pArray = ppvVar4;
        }
        vNodes->nCap = iVar7;
      }
LAB_0043eaa6:
      iVar7 = vNodes->nSize;
      vNodes->nSize = iVar7 + 1;
      vNodes->pArray[iVar7] = puVar3;
      if ((*puVar3 >> 8 & 1) != 0) {
        __assert_fail("pLeaf->fMark == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifUtil.c"
                      ,0x23e,"void If_CutTraverse(If_Man_t *, If_Obj_t *, If_Cut_t *, Vec_Ptr_t *)")
        ;
      }
      *puVar3 = *puVar3 | 0x100;
      uVar6 = uVar6 + 1;
    } while (uVar6 < (byte)pCut->field_0x1f);
  }
  If_CutTraverse_rec(pRoot,vNodes);
  if (0 < vNodes->nSize) {
    lVar5 = 0;
    do {
      *(uint *)vNodes->pArray[lVar5] = *vNodes->pArray[lVar5] & 0xfffffeff;
      lVar5 = lVar5 + 1;
    } while (lVar5 < vNodes->nSize);
  }
  return;
}

Assistant:

void If_CutTraverse( If_Man_t * p, If_Obj_t * pRoot, If_Cut_t * pCut, Vec_Ptr_t * vNodes )
{
    If_Obj_t * pLeaf;
    int i;
    // collect the internal nodes of the cut
    Vec_PtrClear( vNodes );
    If_CutForEachLeaf( p, pCut, pLeaf, i )
    {
        Vec_PtrPush( vNodes, pLeaf );
        assert( pLeaf->fMark == 0 );
        pLeaf->fMark = 1;
    }
    // collect other nodes
    If_CutTraverse_rec( pRoot, vNodes );
    // clean the mark
    Vec_PtrForEachEntry( If_Obj_t *, vNodes, pLeaf, i )
        pLeaf->fMark = 0;
}